

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improveBipartition
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  size_type sizeB;
  ostream *poVar5;
  runtime_error *this_00;
  reference puVar6;
  reference pvVar7;
  PartitionGraph *this_01;
  reference puVar8;
  size_type in_RDX;
  size_type in_RSI;
  long *in_RDI;
  long lVar9;
  double dVar10;
  reference rVar11;
  pair<bool,_unsigned_long> pVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  unsigned_long *v_8;
  iterator __end3_6;
  iterator __begin3_6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_6;
  unsigned_long v_7;
  iterator __end4_3;
  iterator __begin4_3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range4_3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  partition_4;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range3_5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  unsigned_long v_6;
  iterator __end5_1;
  iterator __begin5_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range5_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  partition_3;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range4_2;
  unsigned_long *w_2;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  unsigned_long *v_5;
  iterator __end3_4;
  iterator __begin3_4;
  value_type *__range3_4;
  unsigned_long v_4;
  iterator __end6;
  iterator __begin6;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range6;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  partition_2;
  const_iterator __end5;
  const_iterator __begin5;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range5;
  Move move;
  unsigned_long w_1;
  unsigned_long v_3;
  pair<unsigned_long,_unsigned_long> *vw;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range3_3;
  value_type_conflict *v_2;
  const_iterator __end4;
  const_iterator __begin4;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range4;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *partition_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range3_2;
  Move best;
  size_t iter;
  size_t maxMoves;
  value_type_conflict *v_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range3_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *partition;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *__range2_1;
  unsigned_long w;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  unsigned_long v;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  move_edges;
  value_type *partitionB;
  value_type *partitionA;
  double bestBranchingObjective;
  double bestInternalObjective;
  Cost bestObjective;
  size_t bestNumberOfMoves;
  size_t numberOfMoves;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffff5f8;
  Move *in_stack_fffffffffffff600;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffff608;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffff610;
  size_type in_stack_fffffffffffff618;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff620;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *v_00;
  size_type in_stack_fffffffffffff628;
  value_type vVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff630;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *partitionId;
  size_t in_stack_fffffffffffff650;
  size_t in_stack_fffffffffffff658;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffff660;
  size_t in_stack_fffffffffffff670;
  size_t in_stack_fffffffffffff678;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffff680;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_960;
  value_type in_stack_fffffffffffff710;
  size_t in_stack_fffffffffffff718;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_fffffffffffff720;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_8d0;
  bool local_859;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_7b0;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_748;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6f8;
  undefined1 *local_6f0;
  size_type local_6e8;
  _Node_iterator_base<unsigned_long,_false> local_6e0;
  _Node_iterator_base<unsigned_long,_false> local_6d8;
  undefined1 *local_6d0;
  undefined1 local_6c8 [56];
  const_iterator local_690;
  const_iterator local_688;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_680;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_678;
  undefined1 local_640 [56];
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_608;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_5f8;
  undefined1 local_5f0 [24];
  size_type local_5d8;
  _Node_iterator_base<unsigned_long,_false> local_5d0;
  _Node_iterator_base<unsigned_long,_false> local_5c8;
  undefined1 *local_5c0;
  undefined1 local_5b8 [56];
  const_iterator local_580;
  const_iterator local_578;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_570;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_568;
  undefined1 local_530 [56];
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_4f8;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_4e8;
  pair<unsigned_long,_unsigned_long> local_4e0;
  pair<unsigned_long,_unsigned_long> local_4d0;
  undefined1 local_4c0;
  unsigned_long local_4b8;
  reference local_4b0;
  _Node_iterator_base<unsigned_long,_false> local_4a8;
  _Node_iterator_base<unsigned_long,_false> local_4a0;
  reference local_498;
  reference local_490;
  _Node_iterator_base<unsigned_long,_false> local_488;
  _Node_iterator_base<unsigned_long,_false> local_480;
  reference local_478;
  size_type local_470;
  _Node_iterator_base<unsigned_long,_false> local_468;
  _Node_iterator_base<unsigned_long,_false> local_460;
  undefined1 *local_458;
  undefined1 local_450 [56];
  const_iterator local_418;
  const_iterator local_410;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_408;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_400;
  undefined1 local_3c8 [56];
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_390;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_380;
  reference local_378;
  undefined1 local_368 [32];
  double local_348;
  reference local_340;
  reference local_330;
  reference local_320;
  size_type local_310;
  size_type local_308;
  reference local_300;
  pair<unsigned_long,_unsigned_long> *local_2f8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_2f0;
  undefined1 *local_2e8;
  reference local_2e0;
  reference local_2d0;
  _Node_iterator_base<unsigned_long,_false> local_2c8;
  _Node_iterator_base<unsigned_long,_false> local_2c0;
  const_iterator local_2b8;
  const_iterator local_2b0;
  const_iterator local_2a8;
  const_iterator local_2a0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_298;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_290;
  undefined1 local_258 [56];
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_220;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_210;
  undefined1 local_208 [8];
  size_type local_200;
  long local_1f8;
  long local_1f0;
  double local_1e8;
  ulong local_1e0;
  size_t local_1d8;
  reference local_1d0;
  reference local_1c0;
  _Node_iterator_base<unsigned_long,_false> local_1b8;
  _Node_iterator_base<unsigned_long,_false> local_1b0;
  const_iterator local_1a8;
  const_iterator local_1a0;
  const_iterator local_198;
  const_iterator local_190;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_188;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_180;
  undefined1 local_148 [56];
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_110;
  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *local_100;
  undefined4 local_f4;
  pair<unsigned_long,_unsigned_long> local_f0;
  pair<unsigned_long,_unsigned_long> local_e0;
  undefined1 local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  _Node_iterator_base<unsigned_long,_false> local_a8;
  _Node_iterator_base<unsigned_long,_false> local_a0;
  reference local_98;
  unsigned_long local_90;
  _Node_iterator_base<unsigned_long,_false> local_88;
  _Node_iterator_base<unsigned_long,_false> local_80;
  reference local_78;
  undefined1 local_70 [24];
  reference local_58;
  reference local_50;
  long local_48;
  long local_40;
  double local_38;
  size_t local_30;
  size_t local_28;
  size_type local_20;
  size_type local_18;
  size_t local_8;
  
  local_28 = 0;
  local_30 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_38 = (double)(**(code **)(*in_RDI + 0x10))();
  local_40 = in_RDI[0x19];
  local_48 = in_RDI[0x1a];
  local_50 = std::
             vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x13),local_18);
  local_58 = std::
             vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0x13),local_20);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x1d9615);
  local_78 = local_50;
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::begin(in_stack_fffffffffffff5f8);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::end(in_stack_fffffffffffff5f8);
  while( true ) {
    bVar2 = std::__detail::operator!=(&local_80,&local_88);
    if (!bVar2) break;
    puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                       ((_Node_iterator<unsigned_long,_true,_false> *)0x1d967a);
    local_90 = *puVar6;
    local_98 = local_58;
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::begin(in_stack_fffffffffffff5f8);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(in_stack_fffffffffffff5f8);
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_a0,&local_a8);
      if (!bVar2) break;
      puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                         ((_Node_iterator<unsigned_long,_true,_false> *)0x1d96ea);
      local_b0 = *puVar6;
      ProblemGraph::graph(*(ProblemGraph **)in_RDI[1]);
      pVar12 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                         (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                          in_stack_fffffffffffff670);
      local_b8 = pVar12.second;
      local_c0 = pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pVar13 = std::make_pair<unsigned_long_const&,unsigned_long_const&>
                           (&in_stack_fffffffffffff600->vertex_,
                            (unsigned_long *)in_stack_fffffffffffff5f8);
        local_e0 = pVar13;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
        pVar13 = std::make_pair<unsigned_long_const&,unsigned_long_const&>
                           (&in_stack_fffffffffffff600->vertex_,
                            (unsigned_long *)in_stack_fffffffffffff5f8);
        local_f0 = pVar13;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
      }
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
    }
    std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
              ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
  }
  bVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)in_stack_fffffffffffff610);
  if (bVar2) {
    local_8 = 0;
  }
  else {
    local_188 = &local_180;
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    local_188 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)local_148;
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    local_110._M_array = &local_180;
    local_110._M_len = 2;
    local_100 = &local_110;
    local_190 = std::
                initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                ::begin(local_100);
    local_198 = std::
                initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                       *)in_stack_fffffffffffff600);
    for (; local_190 != local_198; local_190 = local_190 + 1) {
      local_1a0 = local_190;
      local_1a8 = local_190;
      local_1b0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(in_stack_fffffffffffff5f8);
      local_1b8._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffff5f8);
      while( true ) {
        bVar2 = std::__detail::operator!=(&local_1b0,&local_1b8);
        if (!bVar2) break;
        local_1c0 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                              ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1d9a46);
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
        local_1d0 = rVar11;
        std::_Bit_reference::operator=(&local_1d0,false);
        std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_const_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
      }
    }
    local_f4 = 6;
    local_748 = &local_110;
    do {
      local_748 = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                   *)&local_748[-4]._M_len;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1d9b26);
    } while (local_748 !=
             (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
              *)&local_180);
    lVar9 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_18,local_20);
    in_RDI[0x1c] = lVar9;
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x1d9bd2);
    sizeB = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x1d9be7);
    local_1d8 = calcMaximumMoves(sVar4,sizeB);
    for (local_1e0 = 0; local_1e0 < local_1d8 + 1; local_1e0 = local_1e0 + 1) {
      Move::Move(in_stack_fffffffffffff600);
      local_298 = &local_290;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_298 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_258;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_220._M_array = &local_290;
      local_220._M_len = 2;
      local_210 = &local_220;
      local_2a0 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::begin(local_210);
      local_2a8 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffff600);
      for (; local_2a0 != local_2a8; local_2a0 = local_2a0 + 1) {
        local_2b0 = local_2a0;
        local_2b8 = local_2a0;
        local_2c0._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(in_stack_fffffffffffff5f8);
        local_2c8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end(in_stack_fffffffffffff5f8);
        while( true ) {
          bVar2 = std::__detail::operator!=(&local_2c0,&local_2c8);
          if (!bVar2) break;
          local_2d0 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                                ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1d9e00);
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
          local_2e0 = rVar11;
          std::_Bit_reference::operator=(&local_2e0,false);
          std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++
                    ((_Node_const_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
        }
      }
      local_f4 = 0xd;
      local_7b0 = &local_220;
      do {
        local_7b0 = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                     *)&local_7b0[-4]._M_len;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1d9ee0);
      } while (local_7b0 !=
               (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                *)&local_290);
      local_2e8 = local_70;
      local_2f0._M_current =
           (pair<unsigned_long,_unsigned_long> *)
           std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff5f8);
      local_2f8 = (pair<unsigned_long,_unsigned_long> *)
                  std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)in_stack_fffffffffffff5f8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_fffffffffffff600,
                           (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_fffffffffffff5f8);
        if (!bVar2) break;
        local_300 = __gnu_cxx::
                    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                    ::operator*(&local_2f0);
        local_308 = local_300->first;
        local_310 = local_300->second;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x16)
                            ,local_308);
        vVar14 = *pvVar7;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x16)
                            ,local_310);
        if (vVar14 == *pvVar7) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_308);
          poVar5 = std::operator<<(poVar5,"(");
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),local_308);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar7);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_310);
          poVar5 = std::operator<<(poVar5,"(");
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),local_310);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar7);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"vertexLabels_ and partitions_ are inconsistent!");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
        local_320 = rVar11;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_320);
        local_859 = true;
        if (!bVar2) {
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
          local_330 = rVar11;
          local_859 = std::_Bit_reference::operator_cast_to_bool(&local_330);
        }
        if (local_859 == false) {
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
          local_340 = rVar11;
          std::_Bit_reference::operator=(&local_340,true);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),local_308);
          std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                        *)(in_RDI + 0x13),*pvVar7);
          sVar4 = std::
                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1da371);
          if (1 < sVar4) {
            proposeSingleMove(in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                              in_stack_fffffffffffff650);
            bVar2 = lowerThanWithEpsilon(local_1e8,local_348);
            if (bVar2) {
              memcpy(local_208,local_368,0x28);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator++(&local_2f0);
      }
      uVar3 = std::isinf(local_1e8);
      if ((uVar3 & 1) != 0) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x16),local_200)
      ;
      applySingleMove(in_stack_fffffffffffff610,(size_t)in_stack_fffffffffffff608,
                      (size_t)in_stack_fffffffffffff600);
      in_RDI[0x1c] = local_1f8;
      in_RDI[0x1a] = local_1f0;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
      local_378 = rVar11;
      std::_Bit_reference::operator=(&local_378,true);
      dVar1 = local_38;
      local_28 = local_28 + 1;
      dVar10 = (double)(**(code **)(*in_RDI + 0x10))();
      bVar2 = lowerThanWithEpsilon(dVar1,dVar10);
      if (bVar2) {
        local_38 = (double)(**(code **)(*in_RDI + 0x10))();
        local_30 = local_28;
        local_40 = in_RDI[0x19];
        local_48 = in_RDI[0x1a];
        local_408 = &local_400;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        local_408 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)local_3c8;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        local_390._M_array = &local_400;
        local_390._M_len = 2;
        local_380 = &local_390;
        local_410 = std::
                    initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                    ::begin(local_380);
        local_418 = std::
                    initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                    ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                           *)in_stack_fffffffffffff600);
        for (; local_410 != local_418; local_410 = local_410 + 1) {
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
          local_458 = local_450;
          local_460._M_cur =
               (__node_type *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::begin(in_stack_fffffffffffff5f8);
          local_468._M_cur =
               (__node_type *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end(in_stack_fffffffffffff5f8);
          while( true ) {
            bVar2 = std::__detail::operator!=(&local_460,&local_468);
            if (!bVar2) break;
            puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                               ((_Node_iterator<unsigned_long,_true,_false> *)0x1da783);
            local_470 = *puVar6;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x16),local_470);
            in_stack_fffffffffffff710 = *pvVar7;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x31),local_470);
            *pvVar7 = in_stack_fffffffffffff710;
            std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                      ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
          }
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)0x1da831);
        }
        local_f4 = 0x13;
        local_8d0 = &local_390;
        do {
          local_8d0 = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                       *)&local_8d0[-4]._M_len;
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)0x1da863);
        } while (local_8d0 !=
                 (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  *)&local_400);
      }
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)0x1da8ce);
      local_478 = local_50;
      local_480._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(in_stack_fffffffffffff5f8);
      local_488._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end(in_stack_fffffffffffff5f8);
      while( true ) {
        bVar2 = std::__detail::operator!=(&local_480,&local_488);
        if (!bVar2) break;
        local_490 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                              ((_Node_iterator<unsigned_long,_true,_false> *)0x1da933);
        local_498 = local_58;
        local_4a0._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(in_stack_fffffffffffff5f8);
        local_4a8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end(in_stack_fffffffffffff5f8);
        while( true ) {
          bVar2 = std::__detail::operator!=(&local_4a0,&local_4a8);
          if (!bVar2) break;
          local_4b0 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                                ((_Node_iterator<unsigned_long,_true,_false> *)0x1da9a0);
          ProblemGraph::graph(*(ProblemGraph **)in_RDI[1]);
          pVar12 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                             (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                              in_stack_fffffffffffff670);
          local_4b8 = pVar12.second;
          local_4c0 = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pVar13 = std::make_pair<unsigned_long_const&,unsigned_long_const&>
                               (&in_stack_fffffffffffff600->vertex_,
                                (unsigned_long *)in_stack_fffffffffffff5f8);
            local_4d0 = pVar13;
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
            pVar13 = std::make_pair<unsigned_long_const&,unsigned_long_const&>
                               (&in_stack_fffffffffffff600->vertex_,
                                (unsigned_long *)in_stack_fffffffffffff5f8);
            local_4e0 = pVar13;
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
          }
          std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                    ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
        }
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
      }
    }
    applyMerge(in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
    dVar1 = local_38;
    local_28 = local_28 + 1;
    dVar10 = (double)(**(code **)(*in_RDI + 0x10))();
    bVar2 = lowerThanWithEpsilon(dVar1,dVar10);
    if (bVar2) {
      local_30 = local_28;
      local_570 = &local_568;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_570 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_530;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_4f8._M_array = &local_568;
      local_4f8._M_len = 2;
      local_4e8 = &local_4f8;
      local_578 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::begin(local_4e8);
      local_580 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffff600);
      for (; local_578 != local_580; local_578 = local_578 + 1) {
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        local_5c0 = local_5b8;
        local_5c8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(in_stack_fffffffffffff5f8);
        local_5d0._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end(in_stack_fffffffffffff5f8);
        while( true ) {
          bVar2 = std::__detail::operator!=(&local_5c8,&local_5d0);
          if (!bVar2) break;
          puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                             ((_Node_iterator<unsigned_long,_true,_false> *)0x1dad79);
          local_5d8 = *puVar6;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),local_5d8);
          vVar14 = *pvVar7;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x31),local_5d8);
          *pvVar7 = vVar14;
          std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                    ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
        }
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1dae24);
      }
      local_f4 = 0x1b;
      local_960 = &local_4f8;
      do {
        local_960 = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                     *)&local_960[-4]._M_len;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1dae53);
      } while (local_960 !=
               (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                *)&local_568);
    }
    if (local_30 < local_28) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1daecb);
      this_01 = (PartitionGraph *)
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1daed8);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x1daeea);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      local_680 = &local_678;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_680 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_640;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      local_608._M_array = &local_678;
      local_608._M_len = 2;
      local_5f8 = &local_608;
      local_688 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::begin(local_5f8);
      local_690 = std::
                  initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  ::end((initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffff600);
      for (; local_688 != local_690; local_688 = local_688 + 1) {
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        local_6d0 = local_6c8;
        local_6d8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(in_stack_fffffffffffff5f8);
        local_6e0._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end(in_stack_fffffffffffff5f8);
        while( true ) {
          bVar2 = std::__detail::operator!=(&local_6d8,&local_6e0);
          if (!bVar2) break;
          puVar6 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                             ((_Node_iterator<unsigned_long,_true,_false> *)0x1db0c0);
          local_6e8 = *puVar6;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x31),local_6e8);
          vVar14 = *pvVar7;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x16),local_6e8);
          if (vVar14 != *pvVar7) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff610,&in_stack_fffffffffffff608->first);
          }
          std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                    ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffff600);
        }
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1db192);
      }
      local_f4 = 0x1f;
      partitionId = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                     *)&local_678;
      v_00 = &local_608;
      do {
        v_00 = (initializer_list<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                *)&v_00[-4]._M_len;
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x1db1be);
      } while (v_00 != partitionId);
      local_6f0 = local_5f0;
      local_6f8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff5f8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff5f8)
      ;
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff600,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff5f8);
        if (!bVar2) break;
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_6f8);
        in_stack_fffffffffffff5f8 =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)(in_RDI + 3);
        in_stack_fffffffffffff600 = (Move *)*puVar8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x31),
                   (size_type)in_stack_fffffffffffff600);
        PartitionGraph::forceMove(this_01,(size_t)v_00,(size_t)partitionId);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_6f8);
      }
      PartitionGraph::updateEdgesOfPartition
                ((PartitionGraph *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      PartitionGraph::updateEdgesOfPartition
                ((PartitionGraph *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      in_RDI[0x19] = local_40;
      in_RDI[0x1a] = local_48;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff610)
      ;
    }
    local_8 = local_30;
  }
  local_f4 = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffff610);
  return local_8;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improveBipartition(size_t partitionIdA,
                                                  size_t partitionIdB)
{
    size_t numberOfMoves = 0;

    size_t bestNumberOfMoves = 0;
    auto bestObjective = getObjective();
    auto bestInternalObjective = internalObjective_;
    auto bestBranchingObjective = branchingObjective_;

    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    // find moves.
    std::vector<std::pair<size_t, size_t>> move_edges;
    for (const auto v : partitionA) {
        for (const auto w : partitionB) {

            if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                move_edges.emplace_back(std::make_pair(v, w));
                move_edges.emplace_back(std::make_pair(w, v));
            }
        }
    }

    if (move_edges.empty()) {
        return 0;
    }

    // mark nodes as available for swapping.
    for (const auto& partition : { partitionA, partitionB }) {
        for (const auto& v : partition) {
            swapped_[v] = false;
        }
    }

    // start greedy search for improving moves
    localBranchingObjective_ =
        getBaselineBranchingObjective(partitionIdA, partitionIdB);

    const size_t maxMoves =
        calcMaximumMoves(partitionA.size(), partitionB.size());
    for (size_t iter = 0; iter < maxMoves + 1; ++iter) {

        Move best;

        // reset visits.
        for (const auto& partition : { partitionA, partitionB }) {
            for (const auto& v : partition) {
                visited_[v] = false;
            }
        }

        for (const auto& vw : move_edges) {

            const auto v = vw.first;
            const auto w = vw.second;

            // /* Debug
            if (partitionGraph_.vertexLabels_[v] ==
                partitionGraph_.vertexLabels_[w]) {
                std::cerr << v << "(" << partitionGraph_.vertexLabels_[v] << ")"
                          << std::endl;
                std::cerr << w << "(" << partitionGraph_.vertexLabels_[w] << ")"
                          << std::endl;
                throw std::runtime_error(
                    "vertexLabels_ and partitions_ are inconsistent!");
            }
            // */

            // prevent swapping back and forth
            if (swapped_[v] || visited_[v]) {
                continue;
            }
            visited_[v] = true;

            // dont let partitions vanish.
            // This case is handled by a complete merge.
            if (partitionGraph_.partitions_[partitionGraph_.vertexLabels_[v]]
                    .size() <= 1) {
                continue;
            }

            const auto move = proposeSingleMove(v, w);
            if (lowerThanWithEpsilon(best.obj_, move.obj_)) {
                best = move;
            }
        }

        // if no move was feasible, then stop searching for moves.
        if (std::isinf(best.obj_)) {
            break;

        } else {
            applySingleMove(best.vertex_,
                            partitionGraph_.vertexLabels_[best.other_]);
            localBranchingObjective_ = best.localBranchingObj_;
            branchingObjective_ = best.branchingObj_;
            swapped_[best.vertex_] = true;
            ++numberOfMoves;

            // keep track of the best labeling.
            if (lowerThanWithEpsilon(bestObjective, getObjective())) {

                bestObjective = getObjective();
                bestNumberOfMoves = numberOfMoves;
                bestInternalObjective = internalObjective_;
                bestBranchingObjective = branchingObjective_;

                // update best vertex labeling.
                for (auto partition : { partitionA, partitionB }) {
                    for (auto v : partition) {
                        bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                    }
                }
            }
        }

        // search new feasible moves.
        move_edges.clear();
        for (const auto& v : partitionA) {
            for (const auto& w : partitionB) {

                if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                    move_edges.emplace_back(std::make_pair(v, w));
                    move_edges.emplace_back(std::make_pair(w, v));
                }
            }
        }
    }

    // Would a merge be better?
    {
        applyMerge(partitionIdA, partitionIdB);
        ++numberOfMoves;

        if (lowerThanWithEpsilon(bestObjective, getObjective())) {

            bestNumberOfMoves = numberOfMoves;

            // update best vertex labeling.
            for (auto partition : { partitionA, partitionB }) {
                for (auto v : partition) {
                    bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                }
            }
        }
    }

    // revert to best labeling.
    if (numberOfMoves > bestNumberOfMoves) {

        std::vector<size_t> buffer;
        buffer.reserve(partitionA.size() + partitionB.size());

        for (auto partition : { partitionA, partitionB }) {
            for (auto v : partition) {
                if (bestVertexLabels_[v] != partitionGraph_.vertexLabels_[v]) {
                    buffer.push_back(v);
                }
            }
        }

        // revert partitions and labels.
        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, bestVertexLabels_[v]);
        }

        // update branching edges.
        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);

        // and revert partial objectives.
        internalObjective_ = bestInternalObjective;
        branchingObjective_ = bestBranchingObjective;
    }

    // assert(std::abs(getObjective() - bestObjective) < EPSILON);

    return bestNumberOfMoves;
}